

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm_sse2.c
# Opt level: O3

void av1_lowbd_fwd_txfm2d_16x32_sse2
               (int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  byte bVar2;
  undefined8 uVar3;
  undefined1 auVar4 [12];
  undefined1 auVar5 [12];
  undefined1 auVar6 [12];
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  undefined1 auVar9 [12];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [12];
  undefined1 auVar13 [12];
  undefined1 auVar14 [12];
  undefined1 auVar15 [12];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined1 auVar19 [12];
  int8_t *piVar20;
  bool bVar21;
  int16_t *piVar22;
  uint uVar23;
  undefined7 in_register_00000009;
  long lVar24;
  undefined8 *puVar25;
  int32_t *piVar26;
  bool bVar27;
  ulong uVar28;
  long lVar29;
  undefined8 *puVar30;
  undefined4 uVar31;
  undefined1 auVar33 [12];
  undefined1 auVar36 [16];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined4 uVar43;
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar63 [16];
  undefined1 auVar67 [16];
  undefined1 auVar71 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar81 [16];
  undefined1 auVar85 [16];
  undefined1 auVar89 [16];
  undefined1 auVar93 [16];
  undefined4 uVar94;
  undefined1 auVar96 [12];
  undefined1 auVar97 [12];
  undefined1 auVar98 [12];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar115 [16];
  undefined1 auVar118 [16];
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined4 uVar128;
  undefined1 auVar130 [12];
  undefined1 auVar131 [12];
  undefined1 auVar132 [12];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar144 [16];
  undefined1 auVar147 [16];
  undefined1 auVar150 [16];
  __m128i buf0 [32];
  __m128i buf1 [64];
  code *local_648 [2];
  undefined8 local_638 [2];
  undefined2 local_628;
  undefined2 uStack_626;
  undefined2 uStack_624;
  undefined2 uStack_622;
  undefined2 uStack_620;
  undefined2 uStack_61e;
  undefined2 uStack_61c;
  undefined2 uStack_61a;
  undefined1 local_618 [16];
  undefined2 local_608;
  undefined2 uStack_606;
  undefined2 uStack_604;
  undefined2 uStack_602;
  undefined2 uStack_600;
  undefined2 uStack_5fe;
  undefined2 uStack_5fc;
  undefined2 uStack_5fa;
  undefined1 local_5f8 [16];
  undefined2 local_5e8;
  undefined2 uStack_5e6;
  undefined2 uStack_5e4;
  undefined2 uStack_5e2;
  undefined2 uStack_5e0;
  undefined2 uStack_5de;
  undefined2 uStack_5dc;
  undefined2 uStack_5da;
  undefined1 local_5d8 [16];
  undefined2 local_5c8;
  undefined2 uStack_5c6;
  undefined2 uStack_5c4;
  undefined2 uStack_5c2;
  undefined2 uStack_5c0;
  undefined2 uStack_5be;
  undefined2 uStack_5bc;
  undefined2 uStack_5ba;
  undefined1 local_5b8 [16];
  undefined2 local_5a8;
  undefined2 uStack_5a6;
  undefined2 uStack_5a4;
  undefined2 uStack_5a2;
  undefined2 uStack_5a0;
  undefined2 uStack_59e;
  undefined2 uStack_59c;
  undefined2 uStack_59a;
  undefined1 local_598 [16];
  undefined2 local_588;
  undefined2 uStack_586;
  undefined2 uStack_584;
  undefined2 uStack_582;
  undefined2 uStack_580;
  undefined2 uStack_57e;
  undefined2 uStack_57c;
  undefined2 uStack_57a;
  undefined1 local_578 [16];
  undefined2 local_568;
  undefined2 uStack_566;
  undefined2 uStack_564;
  undefined2 uStack_562;
  undefined2 uStack_560;
  undefined2 uStack_55e;
  undefined2 uStack_55c;
  undefined2 uStack_55a;
  undefined1 local_558 [16];
  undefined2 local_548;
  undefined2 uStack_546;
  undefined2 uStack_544;
  undefined2 uStack_542;
  undefined2 uStack_540;
  undefined2 uStack_53e;
  undefined2 uStack_53c;
  undefined2 uStack_53a;
  undefined1 local_538 [16];
  undefined2 local_528;
  undefined2 uStack_526;
  undefined2 uStack_524;
  undefined2 uStack_522;
  undefined2 uStack_520;
  undefined2 uStack_51e;
  undefined2 uStack_51c;
  undefined2 uStack_51a;
  undefined1 local_518 [16];
  undefined2 local_508;
  undefined2 uStack_506;
  undefined2 uStack_504;
  undefined2 uStack_502;
  undefined2 uStack_500;
  undefined2 uStack_4fe;
  undefined2 uStack_4fc;
  undefined2 uStack_4fa;
  undefined1 local_4f8 [16];
  undefined2 local_4e8;
  undefined2 uStack_4e6;
  undefined2 uStack_4e4;
  undefined2 uStack_4e2;
  undefined2 uStack_4e0;
  undefined2 uStack_4de;
  undefined2 uStack_4dc;
  undefined2 uStack_4da;
  undefined1 local_4d8 [16];
  undefined2 local_4c8;
  undefined2 uStack_4c6;
  undefined2 uStack_4c4;
  undefined2 uStack_4c2;
  undefined2 uStack_4c0;
  undefined2 uStack_4be;
  undefined2 uStack_4bc;
  undefined2 uStack_4ba;
  undefined1 local_4b8 [16];
  undefined2 local_4a8;
  undefined2 uStack_4a6;
  undefined2 uStack_4a4;
  undefined2 uStack_4a2;
  undefined2 uStack_4a0;
  undefined2 uStack_49e;
  undefined2 uStack_49c;
  undefined2 uStack_49a;
  undefined1 local_498 [16];
  undefined2 local_488;
  undefined2 uStack_486;
  undefined2 uStack_484;
  undefined2 uStack_482;
  undefined2 uStack_480;
  undefined2 uStack_47e;
  undefined2 uStack_47c;
  undefined2 uStack_47a;
  undefined1 local_478 [16];
  undefined2 local_468;
  undefined2 uStack_466;
  undefined2 uStack_464;
  undefined2 uStack_462;
  undefined2 uStack_460;
  undefined2 uStack_45e;
  undefined2 uStack_45c;
  undefined2 uStack_45a;
  undefined1 local_458 [16];
  undefined2 local_448;
  undefined2 uStack_446;
  undefined2 uStack_444;
  undefined2 uStack_442;
  undefined2 uStack_440;
  undefined2 uStack_43e;
  undefined2 uStack_43c;
  undefined2 uStack_43a;
  undefined8 local_438 [4];
  undefined8 uStack_418;
  undefined4 auStack_410 [6];
  undefined8 uStack_3f8;
  undefined8 auStack_3f0 [3];
  undefined8 uStack_3d8;
  undefined4 auStack_3d0 [38];
  undefined8 local_338 [4];
  undefined8 uStack_318;
  undefined4 auStack_310 [6];
  undefined8 uStack_2f8;
  undefined8 auStack_2f0 [3];
  undefined8 uStack_2d8;
  undefined4 auStack_2d0 [38];
  undefined8 auStack_238 [4];
  undefined8 uStack_218;
  undefined4 auStack_210 [6];
  undefined8 uStack_1f8;
  undefined8 auStack_1f0 [3];
  undefined8 uStack_1d8;
  undefined4 auStack_1d0 [38];
  undefined8 auStack_138 [4];
  undefined1 auStack_118 [16];
  undefined8 auStack_108 [6];
  undefined1 auStack_d8 [16];
  undefined8 auStack_c8 [19];
  undefined1 auVar32 [12];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar44 [12];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar56 [16];
  undefined1 auVar60 [16];
  undefined1 auVar64 [16];
  undefined1 auVar68 [16];
  undefined1 auVar72 [16];
  undefined1 auVar61 [16];
  undefined1 auVar65 [16];
  undefined1 auVar69 [16];
  undefined1 auVar73 [16];
  undefined1 auVar62 [16];
  undefined1 auVar66 [16];
  undefined1 auVar70 [16];
  undefined1 auVar74 [16];
  undefined1 auVar78 [16];
  undefined1 auVar82 [16];
  undefined1 auVar86 [16];
  undefined1 auVar90 [16];
  undefined1 auVar79 [16];
  undefined1 auVar83 [16];
  undefined1 auVar87 [16];
  undefined1 auVar91 [16];
  undefined1 auVar80 [16];
  undefined1 auVar84 [16];
  undefined1 auVar88 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [12];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar119 [16];
  undefined1 auVar122 [16];
  undefined1 auVar114 [16];
  undefined1 auVar117 [16];
  undefined1 auVar120 [16];
  undefined1 auVar123 [16];
  undefined1 auVar129 [12];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar142 [16];
  undefined1 auVar145 [16];
  undefined1 auVar148 [16];
  undefined1 auVar151 [16];
  undefined1 auVar143 [16];
  undefined1 auVar146 [16];
  undefined1 auVar149 [16];
  undefined1 auVar152 [16];
  
  piVar20 = av1_fwd_txfm_shift_ls[9];
  if ((0xe01UL >> ((ulong)tx_type & 0x3f) & 1) != 0) {
    uVar28 = (ulong)(uint)((int)CONCAT71(in_register_00000009,tx_type) << 3);
    local_648[0] = *(code **)((long)col_txfm8x32_arr + uVar28);
    local_648[1] = *(code **)((long)row_txfm8x16_arr + uVar28);
    lVar29 = 0;
    bVar21 = true;
    do {
      bVar27 = bVar21;
      piVar22 = input + lVar29 * 8;
      if ((0xbeafU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar24 = 0x200;
        do {
          uVar3 = *(undefined8 *)(piVar22 + 4);
          *(undefined8 *)((long)local_648 + lVar24) = *(undefined8 *)piVar22;
          *(undefined8 *)((long)local_648 + lVar24 + 8) = uVar3;
          piVar22 = piVar22 + stride;
          lVar24 = lVar24 + -0x10;
        } while (lVar24 != 0);
      }
      else {
        lVar24 = 0;
        do {
          uVar3 = *(undefined8 *)(piVar22 + 4);
          *(undefined8 *)((long)local_638 + lVar24) = *(undefined8 *)piVar22;
          *(undefined8 *)((long)local_638 + lVar24 + 8) = uVar3;
          lVar24 = lVar24 + 0x10;
          piVar22 = piVar22 + stride;
        } while (lVar24 != 0x200);
      }
      bVar2 = *piVar20;
      uVar23 = (uint)(char)bVar2;
      if ((int)uVar23 < 0) {
        auVar36 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar36 = pshuflw(auVar36,auVar36,0);
        auVar36._4_4_ = auVar36._0_4_;
        auVar36._8_4_ = auVar36._0_4_;
        auVar36._12_4_ = auVar36._0_4_;
        lVar24 = 0;
        do {
          auVar58 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar24),auVar36);
          auVar58 = psraw(auVar58,ZEXT416(-uVar23));
          *(undefined1 (*) [16])((long)local_638 + lVar24) = auVar58;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x200);
      }
      else if (bVar2 != 0) {
        lVar24 = 0;
        do {
          auVar36 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar24),ZEXT416(uVar23));
          *(undefined1 (*) [16])((long)local_638 + lVar24) = auVar36;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x200);
      }
      (*local_648[0])(local_638,local_638,0xc);
      bVar2 = piVar20[1];
      uVar23 = (uint)(char)bVar2;
      if ((int)uVar23 < 0) {
        auVar36 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar36 = pshuflw(auVar36,auVar36,0);
        auVar58._0_4_ = auVar36._0_4_;
        auVar58._4_4_ = auVar58._0_4_;
        auVar58._8_4_ = auVar58._0_4_;
        auVar58._12_4_ = auVar58._0_4_;
        lVar24 = 0;
        do {
          auVar36 = paddsw(*(undefined1 (*) [16])((long)local_638 + lVar24),auVar58);
          auVar36 = psraw(auVar36,ZEXT416(-uVar23));
          *(undefined1 (*) [16])((long)local_638 + lVar24) = auVar36;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x200);
      }
      else if (bVar2 != 0) {
        lVar24 = 0;
        do {
          auVar36 = psllw(*(undefined1 (*) [16])((long)local_638 + lVar24),ZEXT416(uVar23));
          *(undefined1 (*) [16])((long)local_638 + lVar24) = auVar36;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x200);
      }
      lVar24 = lVar29 * 0x80;
      auVar62._0_12_ = local_638._0_12_;
      auVar62._12_2_ = local_638[0]._6_2_;
      auVar62._14_2_ = uStack_622;
      auVar61._12_4_ = auVar62._12_4_;
      auVar61._0_10_ = local_638._0_10_;
      auVar61._10_2_ = uStack_624;
      auVar60._10_6_ = auVar61._10_6_;
      auVar60._0_8_ = local_638[0];
      auVar60._8_2_ = local_638[0]._4_2_;
      auVar4._4_8_ = auVar60._8_8_;
      auVar4._2_2_ = uStack_626;
      auVar4._0_2_ = local_638[0]._2_2_;
      auVar59._0_4_ = CONCAT22(local_628,(short)local_638[0]);
      auVar59._4_12_ = auVar4;
      auVar114._0_12_ = local_618._0_12_;
      auVar114._12_2_ = local_618._6_2_;
      auVar114._14_2_ = uStack_602;
      auVar113._12_4_ = auVar114._12_4_;
      auVar113._0_10_ = local_618._0_10_;
      auVar113._10_2_ = uStack_604;
      auVar112._10_6_ = auVar113._10_6_;
      auVar112._0_8_ = local_618._0_8_;
      auVar112._8_2_ = local_618._4_2_;
      auVar5._4_8_ = auVar112._8_8_;
      auVar5._2_2_ = uStack_606;
      auVar5._0_2_ = local_618._2_2_;
      auVar80._0_12_ = local_5f8._0_12_;
      auVar80._12_2_ = local_5f8._6_2_;
      auVar80._14_2_ = uStack_5e2;
      auVar79._12_4_ = auVar80._12_4_;
      auVar79._0_10_ = local_5f8._0_10_;
      auVar79._10_2_ = uStack_5e4;
      auVar78._10_6_ = auVar79._10_6_;
      auVar78._0_8_ = local_5f8._0_8_;
      auVar78._8_2_ = local_5f8._4_2_;
      auVar6._4_8_ = auVar78._8_8_;
      auVar6._2_2_ = uStack_5e6;
      auVar6._0_2_ = local_5f8._2_2_;
      auVar77._0_4_ = CONCAT22(local_5e8,local_5f8._0_2_);
      auVar77._4_12_ = auVar6;
      auVar143._0_12_ = local_5d8._0_12_;
      auVar143._12_2_ = local_5d8._6_2_;
      auVar143._14_2_ = uStack_5c2;
      auVar142._12_4_ = auVar143._12_4_;
      auVar142._0_10_ = local_5d8._0_10_;
      auVar142._10_2_ = uStack_5c4;
      auVar141._10_6_ = auVar142._10_6_;
      auVar141._0_8_ = local_5d8._0_8_;
      auVar141._8_2_ = local_5d8._4_2_;
      auVar7._4_8_ = auVar141._8_8_;
      auVar7._2_2_ = uStack_5c6;
      auVar7._0_2_ = local_5d8._2_2_;
      uVar31 = CONCAT22(uStack_620,(short)local_638[1]);
      auVar32._0_8_ = CONCAT26(uStack_61e,CONCAT24(local_638[1]._2_2_,uVar31));
      auVar32._8_2_ = local_638[1]._4_2_;
      auVar32._10_2_ = uStack_61c;
      auVar40._12_2_ = local_638[1]._6_2_;
      auVar40._0_12_ = auVar32;
      auVar40._14_2_ = uStack_61a;
      uVar94 = CONCAT22(uStack_600,local_618._8_2_);
      auVar95._0_8_ = CONCAT26(uStack_5fe,CONCAT24(local_618._10_2_,uVar94));
      auVar95._8_2_ = local_618._12_2_;
      auVar95._10_2_ = uStack_5fc;
      auVar99._12_2_ = local_618._14_2_;
      auVar99._0_12_ = auVar95;
      auVar99._14_2_ = uStack_5fa;
      uVar43 = CONCAT22(uStack_5e0,local_5f8._8_2_);
      auVar44._0_8_ = CONCAT26(uStack_5de,CONCAT24(local_5f8._10_2_,uVar43));
      auVar44._8_2_ = local_5f8._12_2_;
      auVar44._10_2_ = uStack_5dc;
      auVar48._12_2_ = local_5f8._14_2_;
      auVar48._0_12_ = auVar44;
      auVar48._14_2_ = uStack_5da;
      uVar128 = CONCAT22(uStack_5c0,local_5d8._8_2_);
      auVar129._0_8_ = CONCAT26(uStack_5be,CONCAT24(local_5d8._10_2_,uVar128));
      auVar129._8_2_ = local_5d8._12_2_;
      auVar129._10_2_ = uStack_5bc;
      auVar133._12_2_ = local_5d8._14_2_;
      auVar133._0_12_ = auVar129;
      auVar133._14_2_ = uStack_5ba;
      auVar104._0_8_ = auVar59._0_8_;
      auVar104._8_4_ = auVar4._0_4_;
      auVar104._12_4_ = auVar5._0_4_;
      auVar108._0_8_ = auVar77._0_8_;
      auVar108._8_4_ = auVar6._0_4_;
      auVar108._12_4_ = auVar7._0_4_;
      auVar124._8_4_ = (int)((ulong)auVar32._0_8_ >> 0x20);
      auVar124._0_8_ = auVar32._0_8_;
      auVar124._12_4_ = (int)((ulong)auVar95._0_8_ >> 0x20);
      auVar137._8_4_ = (int)((ulong)auVar44._0_8_ >> 0x20);
      auVar137._0_8_ = auVar44._0_8_;
      auVar137._12_4_ = (int)((ulong)auVar129._0_8_ >> 0x20);
      local_438[lVar29 * 0x10] = CONCAT44(CONCAT22(local_608,local_618._0_2_),auVar59._0_4_);
      local_438[lVar29 * 0x10 + 1] = CONCAT44(CONCAT22(local_5c8,local_5d8._0_2_),auVar77._0_4_);
      local_438[lVar29 * 0x10 + 2] = auVar104._8_8_;
      (&uStack_418)[lVar29 * 0x10 + -1] = auVar108._8_8_;
      *(int *)(&uStack_418 + lVar29 * 0x10) = auVar60._8_4_;
      *(int *)((long)&uStack_418 + (lVar29 * 0x20 + 1) * 4) = auVar112._8_4_;
      *(int *)(&uStack_418 + lVar29 * 0x10 + 1) = auVar78._8_4_;
      *(int *)((long)&uStack_418 + (lVar29 * 0x20 + 3) * 4) = auVar141._8_4_;
      *(undefined4 *)(&uStack_418 + lVar29 * 0x10 + 3) = auVar61._12_4_;
      *(undefined4 *)((long)&uStack_418 + (lVar29 * 0x20 + 7) * 4) = auVar113._12_4_;
      *(undefined4 *)(&uStack_3f8 + lVar29 * 0x10) = auVar79._12_4_;
      *(undefined4 *)((long)&uStack_3f8 + lVar24 + 4) = auVar142._12_4_;
      (&uStack_3f8)[lVar29 * 0x10] = CONCAT44(uVar94,uVar31);
      auStack_3f0[lVar29 * 0x10] = CONCAT44(uVar128,uVar43);
      auStack_3f0[lVar29 * 0x10 + 1] = auVar124._8_8_;
      (&uStack_3d8)[lVar29 * 0x10 + -1] = auVar137._8_8_;
      *(int *)(&uStack_3d8 + lVar29 * 0x10) = auVar32._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar29 * 0x20 + 1) * 4) = auVar95._8_4_;
      *(int *)(&uStack_3d8 + lVar29 * 0x10 + 1) = auVar44._8_4_;
      *(int *)((long)&uStack_3d8 + (lVar29 * 0x20 + 3) * 4) = auVar129._8_4_;
      *(int *)(&uStack_3d8 + lVar29 * 0x10 + 3) = auVar40._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar29 * 0x20 + 7) * 4) = auVar99._12_4_;
      *(int *)(&uStack_3d8 + lVar29 * 0x10 + 4) = auVar48._12_4_;
      *(int *)((long)&uStack_3d8 + (lVar29 * 0x20 + 9) * 4) = auVar133._12_4_;
      auVar66._0_12_ = local_5b8._0_12_;
      auVar66._12_2_ = local_5b8._6_2_;
      auVar66._14_2_ = uStack_5a2;
      auVar65._12_4_ = auVar66._12_4_;
      auVar65._0_10_ = local_5b8._0_10_;
      auVar65._10_2_ = uStack_5a4;
      auVar64._10_6_ = auVar65._10_6_;
      auVar64._0_8_ = local_5b8._0_8_;
      auVar64._8_2_ = local_5b8._4_2_;
      auVar8._4_8_ = auVar64._8_8_;
      auVar8._2_2_ = uStack_5a6;
      auVar8._0_2_ = local_5b8._2_2_;
      auVar63._0_4_ = CONCAT22(local_5a8,local_5b8._0_2_);
      auVar63._4_12_ = auVar8;
      auVar117._0_12_ = local_598._0_12_;
      auVar117._12_2_ = local_598._6_2_;
      auVar117._14_2_ = uStack_582;
      auVar116._12_4_ = auVar117._12_4_;
      auVar116._0_10_ = local_598._0_10_;
      auVar116._10_2_ = uStack_584;
      auVar115._10_6_ = auVar116._10_6_;
      auVar115._0_8_ = local_598._0_8_;
      auVar115._8_2_ = local_598._4_2_;
      auVar9._4_8_ = auVar115._8_8_;
      auVar9._2_2_ = uStack_586;
      auVar9._0_2_ = local_598._2_2_;
      auVar84._0_12_ = local_578._0_12_;
      auVar84._12_2_ = local_578._6_2_;
      auVar84._14_2_ = uStack_562;
      auVar83._12_4_ = auVar84._12_4_;
      auVar83._0_10_ = local_578._0_10_;
      auVar83._10_2_ = uStack_564;
      auVar82._10_6_ = auVar83._10_6_;
      auVar82._0_8_ = local_578._0_8_;
      auVar82._8_2_ = local_578._4_2_;
      auVar10._4_8_ = auVar82._8_8_;
      auVar10._2_2_ = uStack_566;
      auVar10._0_2_ = local_578._2_2_;
      auVar81._0_4_ = CONCAT22(local_568,local_578._0_2_);
      auVar81._4_12_ = auVar10;
      auVar146._0_12_ = local_558._0_12_;
      auVar146._12_2_ = local_558._6_2_;
      auVar146._14_2_ = uStack_542;
      auVar145._12_4_ = auVar146._12_4_;
      auVar145._0_10_ = local_558._0_10_;
      auVar145._10_2_ = uStack_544;
      auVar144._10_6_ = auVar145._10_6_;
      auVar144._0_8_ = local_558._0_8_;
      auVar144._8_2_ = local_558._4_2_;
      auVar11._4_8_ = auVar144._8_8_;
      auVar11._2_2_ = uStack_546;
      auVar11._0_2_ = local_558._2_2_;
      uVar31 = CONCAT22(uStack_5a0,local_5b8._8_2_);
      auVar33._0_8_ = CONCAT26(uStack_59e,CONCAT24(local_5b8._10_2_,uVar31));
      auVar33._8_2_ = local_5b8._12_2_;
      auVar33._10_2_ = uStack_59c;
      auVar57._12_2_ = local_5b8._14_2_;
      auVar57._0_12_ = auVar33;
      auVar57._14_2_ = uStack_59a;
      uVar94 = CONCAT22(uStack_580,local_598._8_2_);
      auVar96._0_8_ = CONCAT26(uStack_57e,CONCAT24(local_598._10_2_,uVar94));
      auVar96._8_2_ = local_598._12_2_;
      auVar96._10_2_ = uStack_57c;
      auVar100._12_2_ = local_598._14_2_;
      auVar100._0_12_ = auVar96;
      auVar100._14_2_ = uStack_57a;
      uVar43 = CONCAT22(uStack_560,local_578._8_2_);
      auVar45._0_8_ = CONCAT26(uStack_55e,CONCAT24(local_578._10_2_,uVar43));
      auVar45._8_2_ = local_578._12_2_;
      auVar45._10_2_ = uStack_55c;
      auVar49._12_2_ = local_578._14_2_;
      auVar49._0_12_ = auVar45;
      auVar49._14_2_ = uStack_55a;
      uVar128 = CONCAT22(uStack_540,local_558._8_2_);
      auVar130._0_8_ = CONCAT26(uStack_53e,CONCAT24(local_558._10_2_,uVar128));
      auVar130._8_2_ = local_558._12_2_;
      auVar130._10_2_ = uStack_53c;
      auVar134._12_2_ = local_558._14_2_;
      auVar134._0_12_ = auVar130;
      auVar134._14_2_ = uStack_53a;
      auVar105._0_8_ = auVar63._0_8_;
      auVar105._8_4_ = auVar8._0_4_;
      auVar105._12_4_ = auVar9._0_4_;
      auVar109._0_8_ = auVar81._0_8_;
      auVar109._8_4_ = auVar10._0_4_;
      auVar109._12_4_ = auVar11._0_4_;
      auVar125._8_4_ = (int)((ulong)auVar33._0_8_ >> 0x20);
      auVar125._0_8_ = auVar33._0_8_;
      auVar125._12_4_ = (int)((ulong)auVar96._0_8_ >> 0x20);
      auVar138._8_4_ = (int)((ulong)auVar45._0_8_ >> 0x20);
      auVar138._0_8_ = auVar45._0_8_;
      auVar138._12_4_ = (int)((ulong)auVar130._0_8_ >> 0x20);
      local_338[lVar29 * 0x10] = CONCAT44(CONCAT22(local_588,local_598._0_2_),auVar63._0_4_);
      local_338[lVar29 * 0x10 + 1] = CONCAT44(CONCAT22(local_548,local_558._0_2_),auVar81._0_4_);
      local_338[lVar29 * 0x10 + 2] = auVar105._8_8_;
      (&uStack_318)[lVar29 * 0x10 + -1] = auVar109._8_8_;
      *(int *)(&uStack_318 + lVar29 * 0x10) = auVar64._8_4_;
      *(int *)((long)&uStack_318 + (lVar29 * 0x20 + 1) * 4) = auVar115._8_4_;
      *(int *)(&uStack_318 + lVar29 * 0x10 + 1) = auVar82._8_4_;
      *(int *)((long)&uStack_318 + (lVar29 * 0x20 + 3) * 4) = auVar144._8_4_;
      *(undefined4 *)(&uStack_318 + lVar29 * 0x10 + 3) = auVar65._12_4_;
      *(undefined4 *)((long)&uStack_318 + (lVar29 * 0x20 + 7) * 4) = auVar116._12_4_;
      *(undefined4 *)(&uStack_2f8 + lVar29 * 0x10) = auVar83._12_4_;
      *(undefined4 *)((long)&uStack_2f8 + lVar24 + 4) = auVar145._12_4_;
      (&uStack_2f8)[lVar29 * 0x10] = CONCAT44(uVar94,uVar31);
      auStack_2f0[lVar29 * 0x10] = CONCAT44(uVar128,uVar43);
      auStack_2f0[lVar29 * 0x10 + 1] = auVar125._8_8_;
      (&uStack_2d8)[lVar29 * 0x10 + -1] = auVar138._8_8_;
      *(int *)(&uStack_2d8 + lVar29 * 0x10) = auVar33._8_4_;
      *(int *)((long)&uStack_2d8 + (lVar29 * 0x20 + 1) * 4) = auVar96._8_4_;
      *(int *)(&uStack_2d8 + lVar29 * 0x10 + 1) = auVar45._8_4_;
      *(int *)((long)&uStack_2d8 + (lVar29 * 0x20 + 3) * 4) = auVar130._8_4_;
      *(int *)(&uStack_2d8 + lVar29 * 0x10 + 3) = auVar57._12_4_;
      *(int *)((long)&uStack_2d8 + (lVar29 * 0x20 + 7) * 4) = auVar100._12_4_;
      *(int *)(&uStack_2d8 + lVar29 * 0x10 + 4) = auVar49._12_4_;
      *(int *)((long)&uStack_2d8 + (lVar29 * 0x20 + 9) * 4) = auVar134._12_4_;
      auVar70._0_12_ = local_538._0_12_;
      auVar70._12_2_ = local_538._6_2_;
      auVar70._14_2_ = uStack_522;
      auVar69._12_4_ = auVar70._12_4_;
      auVar69._0_10_ = local_538._0_10_;
      auVar69._10_2_ = uStack_524;
      auVar68._10_6_ = auVar69._10_6_;
      auVar68._0_8_ = local_538._0_8_;
      auVar68._8_2_ = local_538._4_2_;
      auVar12._4_8_ = auVar68._8_8_;
      auVar12._2_2_ = uStack_526;
      auVar12._0_2_ = local_538._2_2_;
      auVar67._0_4_ = CONCAT22(local_528,local_538._0_2_);
      auVar67._4_12_ = auVar12;
      auVar120._0_12_ = local_518._0_12_;
      auVar120._12_2_ = local_518._6_2_;
      auVar120._14_2_ = uStack_502;
      auVar119._12_4_ = auVar120._12_4_;
      auVar119._0_10_ = local_518._0_10_;
      auVar119._10_2_ = uStack_504;
      auVar118._10_6_ = auVar119._10_6_;
      auVar118._0_8_ = local_518._0_8_;
      auVar118._8_2_ = local_518._4_2_;
      auVar13._4_8_ = auVar118._8_8_;
      auVar13._2_2_ = uStack_506;
      auVar13._0_2_ = local_518._2_2_;
      auVar88._0_12_ = local_4f8._0_12_;
      auVar88._12_2_ = local_4f8._6_2_;
      auVar88._14_2_ = uStack_4e2;
      auVar87._12_4_ = auVar88._12_4_;
      auVar87._0_10_ = local_4f8._0_10_;
      auVar87._10_2_ = uStack_4e4;
      auVar86._10_6_ = auVar87._10_6_;
      auVar86._0_8_ = local_4f8._0_8_;
      auVar86._8_2_ = local_4f8._4_2_;
      auVar14._4_8_ = auVar86._8_8_;
      auVar14._2_2_ = uStack_4e6;
      auVar14._0_2_ = local_4f8._2_2_;
      auVar85._0_4_ = CONCAT22(local_4e8,local_4f8._0_2_);
      auVar85._4_12_ = auVar14;
      auVar149._0_12_ = local_4d8._0_12_;
      auVar149._12_2_ = local_4d8._6_2_;
      auVar149._14_2_ = uStack_4c2;
      auVar148._12_4_ = auVar149._12_4_;
      auVar148._0_10_ = local_4d8._0_10_;
      auVar148._10_2_ = uStack_4c4;
      auVar147._10_6_ = auVar148._10_6_;
      auVar147._0_8_ = local_4d8._0_8_;
      auVar147._8_2_ = local_4d8._4_2_;
      auVar15._4_8_ = auVar147._8_8_;
      auVar15._2_2_ = uStack_4c6;
      auVar15._0_2_ = local_4d8._2_2_;
      uVar31 = CONCAT22(uStack_520,local_538._8_2_);
      auVar34._0_8_ = CONCAT26(uStack_51e,CONCAT24(local_538._10_2_,uVar31));
      auVar34._8_2_ = local_538._12_2_;
      auVar34._10_2_ = uStack_51c;
      auVar37._12_2_ = local_538._14_2_;
      auVar37._0_12_ = auVar34;
      auVar37._14_2_ = uStack_51a;
      uVar94 = CONCAT22(uStack_500,local_518._8_2_);
      auVar97._0_8_ = CONCAT26(uStack_4fe,CONCAT24(local_518._10_2_,uVar94));
      auVar97._8_2_ = local_518._12_2_;
      auVar97._10_2_ = uStack_4fc;
      auVar101._12_2_ = local_518._14_2_;
      auVar101._0_12_ = auVar97;
      auVar101._14_2_ = uStack_4fa;
      uVar43 = CONCAT22(uStack_4e0,local_4f8._8_2_);
      auVar46._0_8_ = CONCAT26(uStack_4de,CONCAT24(local_4f8._10_2_,uVar43));
      auVar46._8_2_ = local_4f8._12_2_;
      auVar46._10_2_ = uStack_4dc;
      auVar50._12_2_ = local_4f8._14_2_;
      auVar50._0_12_ = auVar46;
      auVar50._14_2_ = uStack_4da;
      uVar128 = CONCAT22(uStack_4c0,local_4d8._8_2_);
      auVar131._0_8_ = CONCAT26(uStack_4be,CONCAT24(local_4d8._10_2_,uVar128));
      auVar131._8_2_ = local_4d8._12_2_;
      auVar131._10_2_ = uStack_4bc;
      auVar135._12_2_ = local_4d8._14_2_;
      auVar135._0_12_ = auVar131;
      auVar135._14_2_ = uStack_4ba;
      auVar106._0_8_ = auVar67._0_8_;
      auVar106._8_4_ = auVar12._0_4_;
      auVar106._12_4_ = auVar13._0_4_;
      auVar110._0_8_ = auVar85._0_8_;
      auVar110._8_4_ = auVar14._0_4_;
      auVar110._12_4_ = auVar15._0_4_;
      auVar126._8_4_ = (int)((ulong)auVar34._0_8_ >> 0x20);
      auVar126._0_8_ = auVar34._0_8_;
      auVar126._12_4_ = (int)((ulong)auVar97._0_8_ >> 0x20);
      auVar139._8_4_ = (int)((ulong)auVar46._0_8_ >> 0x20);
      auVar139._0_8_ = auVar46._0_8_;
      auVar139._12_4_ = (int)((ulong)auVar131._0_8_ >> 0x20);
      auStack_238[lVar29 * 0x10] = CONCAT44(CONCAT22(local_508,local_518._0_2_),auVar67._0_4_);
      auStack_238[lVar29 * 0x10 + 1] = CONCAT44(CONCAT22(local_4c8,local_4d8._0_2_),auVar85._0_4_);
      auStack_238[lVar29 * 0x10 + 2] = auVar106._8_8_;
      (&uStack_218)[lVar29 * 0x10 + -1] = auVar110._8_8_;
      *(int *)(&uStack_218 + lVar29 * 0x10) = auVar68._8_4_;
      *(int *)((long)&uStack_218 + (lVar29 * 0x20 + 1) * 4) = auVar118._8_4_;
      *(int *)(&uStack_218 + lVar29 * 0x10 + 1) = auVar86._8_4_;
      *(int *)((long)&uStack_218 + (lVar29 * 0x20 + 3) * 4) = auVar147._8_4_;
      *(undefined4 *)(&uStack_218 + lVar29 * 0x10 + 3) = auVar69._12_4_;
      *(undefined4 *)((long)&uStack_218 + (lVar29 * 0x20 + 7) * 4) = auVar119._12_4_;
      *(undefined4 *)(&uStack_1f8 + lVar29 * 0x10) = auVar87._12_4_;
      *(undefined4 *)((long)&uStack_1f8 + lVar24 + 4) = auVar148._12_4_;
      (&uStack_1f8)[lVar29 * 0x10] = CONCAT44(uVar94,uVar31);
      auStack_1f0[lVar29 * 0x10] = CONCAT44(uVar128,uVar43);
      auStack_1f0[lVar29 * 0x10 + 1] = auVar126._8_8_;
      (&uStack_1d8)[lVar29 * 0x10 + -1] = auVar139._8_8_;
      *(int *)(&uStack_1d8 + lVar29 * 0x10) = auVar34._8_4_;
      *(int *)((long)&uStack_1d8 + (lVar29 * 0x20 + 1) * 4) = auVar97._8_4_;
      *(int *)(&uStack_1d8 + lVar29 * 0x10 + 1) = auVar46._8_4_;
      *(int *)((long)&uStack_1d8 + (lVar29 * 0x20 + 3) * 4) = auVar131._8_4_;
      *(int *)(&uStack_1d8 + lVar29 * 0x10 + 3) = auVar37._12_4_;
      *(int *)((long)&uStack_1d8 + (lVar29 * 0x20 + 7) * 4) = auVar101._12_4_;
      *(int *)(&uStack_1d8 + lVar29 * 0x10 + 4) = auVar50._12_4_;
      *(int *)((long)&uStack_1d8 + (lVar29 * 0x20 + 9) * 4) = auVar135._12_4_;
      auVar74._0_12_ = local_4b8._0_12_;
      auVar74._12_2_ = local_4b8._6_2_;
      auVar74._14_2_ = uStack_4a2;
      auVar73._12_4_ = auVar74._12_4_;
      auVar73._0_10_ = local_4b8._0_10_;
      auVar73._10_2_ = uStack_4a4;
      auVar72._10_6_ = auVar73._10_6_;
      auVar72._0_8_ = local_4b8._0_8_;
      auVar72._8_2_ = local_4b8._4_2_;
      auVar16._4_8_ = auVar72._8_8_;
      auVar16._2_2_ = uStack_4a6;
      auVar16._0_2_ = local_4b8._2_2_;
      auVar71._0_4_ = CONCAT22(local_4a8,local_4b8._0_2_);
      auVar71._4_12_ = auVar16;
      auVar123._0_12_ = local_498._0_12_;
      auVar123._12_2_ = local_498._6_2_;
      auVar123._14_2_ = uStack_482;
      auVar122._12_4_ = auVar123._12_4_;
      auVar122._0_10_ = local_498._0_10_;
      auVar122._10_2_ = uStack_484;
      auVar121._10_6_ = auVar122._10_6_;
      auVar121._0_8_ = local_498._0_8_;
      auVar121._8_2_ = local_498._4_2_;
      auVar17._4_8_ = auVar121._8_8_;
      auVar17._2_2_ = uStack_486;
      auVar17._0_2_ = local_498._2_2_;
      auVar92._0_12_ = local_478._0_12_;
      auVar92._12_2_ = local_478._6_2_;
      auVar92._14_2_ = uStack_462;
      auVar91._12_4_ = auVar92._12_4_;
      auVar91._0_10_ = local_478._0_10_;
      auVar91._10_2_ = uStack_464;
      auVar90._10_6_ = auVar91._10_6_;
      auVar90._0_8_ = local_478._0_8_;
      auVar90._8_2_ = local_478._4_2_;
      auVar18._4_8_ = auVar90._8_8_;
      auVar18._2_2_ = uStack_466;
      auVar18._0_2_ = local_478._2_2_;
      auVar89._0_4_ = CONCAT22(local_468,local_478._0_2_);
      auVar89._4_12_ = auVar18;
      auVar152._0_12_ = local_458._0_12_;
      auVar152._12_2_ = local_458._6_2_;
      auVar152._14_2_ = uStack_442;
      auVar151._12_4_ = auVar152._12_4_;
      auVar151._0_10_ = local_458._0_10_;
      auVar151._10_2_ = uStack_444;
      auVar150._10_6_ = auVar151._10_6_;
      auVar150._0_8_ = local_458._0_8_;
      auVar150._8_2_ = local_458._4_2_;
      auVar19._4_8_ = auVar150._8_8_;
      auVar19._2_2_ = uStack_446;
      auVar19._0_2_ = local_458._2_2_;
      uVar31 = CONCAT22(uStack_4a0,local_4b8._8_2_);
      auVar35._0_8_ = CONCAT26(uStack_49e,CONCAT24(local_4b8._10_2_,uVar31));
      auVar35._8_2_ = local_4b8._12_2_;
      auVar35._10_2_ = uStack_49c;
      auVar38._12_2_ = local_4b8._14_2_;
      auVar38._0_12_ = auVar35;
      auVar38._14_2_ = uStack_49a;
      uVar94 = CONCAT22(uStack_480,local_498._8_2_);
      auVar98._0_8_ = CONCAT26(uStack_47e,CONCAT24(local_498._10_2_,uVar94));
      auVar98._8_2_ = local_498._12_2_;
      auVar98._10_2_ = uStack_47c;
      auVar102._12_2_ = local_498._14_2_;
      auVar102._0_12_ = auVar98;
      auVar102._14_2_ = uStack_47a;
      uVar43 = CONCAT22(uStack_460,local_478._8_2_);
      auVar47._0_8_ = CONCAT26(uStack_45e,CONCAT24(local_478._10_2_,uVar43));
      auVar47._8_2_ = local_478._12_2_;
      auVar47._10_2_ = uStack_45c;
      auVar51._12_2_ = local_478._14_2_;
      auVar51._0_12_ = auVar47;
      auVar51._14_2_ = uStack_45a;
      uVar128 = CONCAT22(uStack_440,local_458._8_2_);
      auVar132._0_8_ = CONCAT26(uStack_43e,CONCAT24(local_458._10_2_,uVar128));
      auVar132._8_2_ = local_458._12_2_;
      auVar132._10_2_ = uStack_43c;
      auVar136._12_2_ = local_458._14_2_;
      auVar136._0_12_ = auVar132;
      auVar136._14_2_ = uStack_43a;
      auVar107._0_8_ = auVar71._0_8_;
      auVar107._8_4_ = auVar16._0_4_;
      auVar107._12_4_ = auVar17._0_4_;
      auVar111._0_8_ = auVar89._0_8_;
      auVar111._8_4_ = auVar18._0_4_;
      auVar111._12_4_ = auVar19._0_4_;
      auVar127._8_4_ = (int)((ulong)auVar35._0_8_ >> 0x20);
      auVar127._0_8_ = auVar35._0_8_;
      auVar127._12_4_ = (int)((ulong)auVar98._0_8_ >> 0x20);
      auVar140._8_4_ = (int)((ulong)auVar47._0_8_ >> 0x20);
      auVar140._0_8_ = auVar47._0_8_;
      auVar140._12_4_ = (int)((ulong)auVar132._0_8_ >> 0x20);
      auVar75._0_8_ = CONCAT44(auVar121._8_4_,auVar72._8_4_);
      auVar75._8_4_ = auVar73._12_4_;
      auVar75._12_4_ = auVar122._12_4_;
      auVar93._0_8_ = CONCAT44(auVar150._8_4_,auVar90._8_4_);
      auVar93._8_4_ = auVar91._12_4_;
      auVar93._12_4_ = auVar151._12_4_;
      auVar39._0_8_ = CONCAT44(auVar98._8_4_,auVar35._8_4_);
      auVar39._8_4_ = auVar38._12_4_;
      auVar39._12_4_ = auVar102._12_4_;
      auVar52._0_8_ = CONCAT44(auVar132._8_4_,auVar47._8_4_);
      auVar52._8_4_ = auVar51._12_4_;
      auVar52._12_4_ = auVar136._12_4_;
      auStack_138[lVar29 * 0x10] = CONCAT44(CONCAT22(local_488,local_498._0_2_),auVar71._0_4_);
      auStack_138[lVar29 * 0x10 + 1] = CONCAT44(CONCAT22(local_448,local_458._0_2_),auVar89._0_4_);
      auStack_138[lVar29 * 0x10 + 2] = auVar107._8_8_;
      *(long *)(auStack_118 + lVar24 + -8) = auVar111._8_8_;
      auVar103._8_8_ = auVar93._0_8_;
      auVar103._0_8_ = auVar75._0_8_;
      *(undefined1 (*) [16])(auStack_118 + lVar24) = auVar103;
      auStack_108[lVar29 * 0x10] = auVar75._8_8_;
      auStack_108[lVar29 * 0x10 + 1] = auVar93._8_8_;
      auStack_108[lVar29 * 0x10 + 2] = CONCAT44(uVar94,uVar31);
      auStack_108[lVar29 * 0x10 + 3] = CONCAT44(uVar128,uVar43);
      *(long *)(auStack_d8 + lVar24 + -0x10) = auVar127._8_8_;
      *(long *)(auStack_d8 + lVar24 + -8) = auVar140._8_8_;
      auVar76._8_8_ = auVar52._0_8_;
      auVar76._0_8_ = auVar39._0_8_;
      *(undefined1 (*) [16])(auStack_d8 + lVar24) = auVar76;
      auStack_c8[lVar29 * 0x10] = auVar39._8_8_;
      auStack_c8[lVar29 * 0x10 + 1] = auVar52._8_8_;
      lVar29 = 1;
      bVar21 = false;
    } while (bVar27);
    piVar26 = output + 4;
    puVar30 = local_438;
    lVar29 = 0;
    do {
      if ((0x7f1fU >> (tx_type & 0x1f) & 1) == 0 && tx_type < 0x10) {
        lVar24 = 0x100;
        puVar25 = puVar30;
        do {
          uVar3 = puVar25[1];
          *(undefined8 *)((long)local_648 + lVar24) = *puVar25;
          *(undefined8 *)((long)local_648 + lVar24 + 8) = uVar3;
          puVar25 = puVar25 + 2;
          lVar24 = lVar24 + -0x10;
        } while (lVar24 != 0);
        puVar25 = local_638;
      }
      else {
        puVar25 = local_438 + lVar29 * 0x20;
      }
      (*local_648[1])(puVar25,puVar25,0xd);
      auVar58 = _DAT_005690c0;
      auVar36 = _DAT_00565c00;
      bVar2 = piVar20[2];
      uVar23 = (uint)(char)bVar2;
      if ((int)uVar23 < 0) {
        auVar40 = ZEXT416((uint)(1 << (~bVar2 & 0x1f)));
        auVar40 = pshuflw(auVar40,auVar40,0);
        auVar41._0_4_ = auVar40._0_4_;
        auVar41._4_4_ = auVar41._0_4_;
        auVar41._8_4_ = auVar41._0_4_;
        auVar41._12_4_ = auVar41._0_4_;
        lVar24 = 0;
        do {
          auVar40 = paddsw(*(undefined1 (*) [16])((long)puVar25 + lVar24),auVar41);
          auVar40 = psraw(auVar40,ZEXT416(-uVar23));
          *(undefined1 (*) [16])((long)puVar25 + lVar24) = auVar40;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x100);
      }
      else if (bVar2 != 0) {
        lVar24 = 0;
        do {
          auVar40 = psllw(*(undefined1 (*) [16])((long)puVar25 + lVar24),ZEXT416(uVar23));
          *(undefined1 (*) [16])((long)puVar25 + lVar24) = auVar40;
          lVar24 = lVar24 + 0x10;
        } while (lVar24 != 0x100);
      }
      lVar24 = 0;
      do {
        auVar40 = *(undefined1 (*) [16])((long)puVar25 + lVar24);
        auVar56._0_12_ = auVar40._0_12_;
        auVar56._12_2_ = auVar40._6_2_;
        auVar56._14_2_ = auVar36._6_2_;
        auVar55._12_4_ = auVar56._12_4_;
        auVar55._0_10_ = auVar40._0_10_;
        auVar55._10_2_ = auVar36._4_2_;
        auVar54._10_6_ = auVar55._10_6_;
        auVar54._0_8_ = auVar40._0_8_;
        auVar54._8_2_ = auVar40._4_2_;
        auVar53._8_8_ = auVar54._8_8_;
        auVar53._6_2_ = auVar36._2_2_;
        auVar53._4_2_ = auVar40._2_2_;
        auVar53._0_2_ = auVar40._0_2_;
        auVar53._2_2_ = auVar36._0_2_;
        auVar42._2_2_ = 1;
        auVar42._0_2_ = auVar40._8_2_;
        auVar42._4_2_ = auVar40._10_2_;
        auVar42._6_2_ = 1;
        auVar42._8_2_ = auVar40._12_2_;
        auVar42._10_2_ = 1;
        auVar42._12_2_ = auVar40._14_2_;
        auVar42._14_2_ = 1;
        auVar57 = pmaddwd(auVar53,auVar58);
        auVar40 = pmaddwd(auVar42,auVar58);
        piVar1 = piVar26 + lVar24 * 2 + -4;
        *piVar1 = auVar57._0_4_ >> 0xc;
        piVar1[1] = auVar57._4_4_ >> 0xc;
        piVar1[2] = auVar57._8_4_ >> 0xc;
        piVar1[3] = auVar57._12_4_ >> 0xc;
        piVar1 = piVar26 + lVar24 * 2;
        *piVar1 = auVar40._0_4_ >> 0xc;
        piVar1[1] = auVar40._4_4_ >> 0xc;
        piVar1[2] = auVar40._8_4_ >> 0xc;
        piVar1[3] = auVar40._12_4_ >> 0xc;
        lVar24 = lVar24 + 0x10;
      } while (lVar24 != 0x100);
      lVar29 = lVar29 + 1;
      puVar30 = puVar30 + 0x20;
      piVar26 = piVar26 + 8;
    } while (lVar29 != 4);
    return;
  }
  av1_fwd_txfm2d_16x32_c(input,output,stride,tx_type,bd);
  return;
}

Assistant:

void av1_lowbd_fwd_txfm2d_16x32_sse2(const int16_t *input, int32_t *output,
                                     int stride, TX_TYPE tx_type, int bd) {
  (void)bd;
  __m128i buf0[32], buf1[64];
  const int8_t *shift = av1_fwd_txfm_shift_ls[TX_16X32];
  const int txw_idx = get_txw_idx(TX_16X32);
  const int txh_idx = get_txh_idx(TX_16X32);
  const int cos_bit_col = av1_fwd_cos_bit_col[txw_idx][txh_idx];
  const int cos_bit_row = av1_fwd_cos_bit_row[txw_idx][txh_idx];
  const int width = 16;
  const int height = 32;
  const transform_1d_sse2 col_txfm = col_txfm8x32_arr[tx_type];
  const transform_1d_sse2 row_txfm = row_txfm8x16_arr[tx_type];

  if (col_txfm != NULL && row_txfm != NULL) {
    int ud_flip, lr_flip;
    get_flip_cfg(tx_type, &ud_flip, &lr_flip);

    for (int i = 0; i < 2; i++) {
      if (ud_flip) {
        load_buffer_16bit_to_16bit_flip(input + 8 * i, stride, buf0, height);
      } else {
        load_buffer_16bit_to_16bit(input + 8 * i, stride, buf0, height);
      }
      round_shift_16bit(buf0, height, shift[0]);
      col_txfm(buf0, buf0, cos_bit_col);
      round_shift_16bit(buf0, height, shift[1]);
      transpose_16bit_8x8(buf0 + 0 * 8, buf1 + 0 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 1 * 8, buf1 + 1 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 2 * 8, buf1 + 2 * width + 8 * i);
      transpose_16bit_8x8(buf0 + 3 * 8, buf1 + 3 * width + 8 * i);
    }

    for (int i = 0; i < 4; i++) {
      __m128i *buf;
      if (lr_flip) {
        buf = buf0;
        flip_buf_sse2(buf1 + width * i, buf, width);
      } else {
        buf = buf1 + width * i;
      }
      row_txfm(buf, buf, cos_bit_row);
      round_shift_16bit(buf, width, shift[2]);
      store_rect_buffer_16bit_to_32bit_w8(buf, output + 8 * i, height, width);
    }
  } else {
    av1_fwd_txfm2d_16x32_c(input, output, stride, tx_type, bd);
  }
}